

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall
Edge::CollectInputs(Edge *this,bool shell_escape,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *out)

{
  pointer ppNVar1;
  string unescaped;
  string path;
  string local_70;
  string local_50;
  
  for (ppNVar1 = (this->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppNVar1 !=
      (this->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar1 = ppNVar1 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)*ppNVar1);
    if (shell_escape) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::swap((string *)&local_70);
      GetShellEscapedString(&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Edge::CollectInputs(bool shell_escape,
                         std::vector<std::string>* out) const {
  for (std::vector<Node*>::const_iterator it = inputs_.begin();
       it != inputs_.end(); ++it) {
    std::string path = (*it)->PathDecanonicalized();
    if (shell_escape) {
      std::string unescaped;
      unescaped.swap(path);
#ifdef _WIN32
      GetWin32EscapedString(unescaped, &path);
#else
      GetShellEscapedString(unescaped, &path);
#endif
    }
#if __cplusplus >= 201103L
    out->push_back(std::move(path));
#else
    out->push_back(path);
#endif
  }
}